

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setDefaultButton(QMessageBox *this,QPushButton *button)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> local_40;
  QPushButton *button_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  button_local = button;
  QDialogButtonBox::buttons
            ((QList<QAbstractButton_*> *)&local_40,*(QDialogButtonBox **)(lVar1 + 0x2f8));
  bVar2 = QListSpecialMethodsBase<QAbstractButton*>::contains<QPushButton*>
                    ((QListSpecialMethodsBase<QAbstractButton*> *)&local_40,&button_local);
  QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_40);
  if (bVar2) {
    *(QPushButton **)(lVar1 + 800) = button_local;
    QPushButton::setDefault(button_local,true);
    QWidget::setFocus((QWidget *)button_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setDefaultButton(QPushButton *button)
{
    Q_D(QMessageBox);
    if (!d->buttonBox->buttons().contains(button))
        return;
    d->defaultButton = button;
    button->setDefault(true);
    button->setFocus();
}